

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O2

void h2v2_fancy_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                        JSAMPARRAY *output_data_ptr)

{
  JDIMENSION JVar1;
  JSAMPARRAY ppJVar2;
  byte *pbVar3;
  byte *pbVar4;
  JSAMPROW pJVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  
  ppJVar2 = *output_data_ptr;
  lVar8 = 0;
  lVar9 = 0;
  while ((int)lVar9 < cinfo->max_v_samp_factor) {
    lVar9 = (long)(int)lVar9;
    for (iVar10 = 0; iVar10 != 2; iVar10 = iVar10 + 1) {
      pbVar3 = input_data[lVar8];
      pbVar4 = (input_data + lVar8)[(ulong)(iVar10 != 0) * 2 + -1];
      pJVar5 = ppJVar2[lVar9];
      iVar12 = (uint)*pbVar4 + (uint)*pbVar3 + (uint)*pbVar3 * 2;
      iVar6 = (uint)pbVar4[1] + (uint)pbVar3[1] + (uint)pbVar3[1] * 2;
      *pJVar5 = (JSAMPLE)(iVar12 * 4 + 8U >> 4);
      pJVar5[1] = (JSAMPLE)(iVar12 * 3 + iVar6 + 7U >> 4);
      JVar1 = compptr->downsampled_width;
      for (lVar11 = 0; JVar1 - 2 != (int)lVar11; lVar11 = lVar11 + 1) {
        iVar7 = (uint)pbVar4[lVar11 + 2] + (uint)pbVar3[lVar11 + 2] + (uint)pbVar3[lVar11 + 2] * 2;
        pJVar5[lVar11 * 2 + 2] = (JSAMPLE)(iVar12 + iVar6 * 3 + 8U >> 4);
        pJVar5[lVar11 * 2 + 3] = (JSAMPLE)(iVar6 * 3 + iVar7 + 7U >> 4);
        iVar12 = iVar6;
        iVar6 = iVar7;
      }
      lVar9 = lVar9 + 1;
      pJVar5[lVar11 * 2 + 2] = (JSAMPLE)(iVar6 * 3 + iVar12 + 8U >> 4);
      pJVar5[lVar11 * 2 + 3] = (JSAMPLE)(iVar6 * 4 + 7U >> 4);
    }
    lVar8 = lVar8 + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_fancy_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                    JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr0, inptr1, outptr;
#if BITS_IN_JSAMPLE == 8
  register int thiscolsum, lastcolsum, nextcolsum;
#else
  register JLONG thiscolsum, lastcolsum, nextcolsum;
#endif
  register JDIMENSION colctr;
  int inrow, outrow, v;

  inrow = outrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    for (v = 0; v < 2; v++) {
      /* inptr0 points to nearest input row, inptr1 points to next nearest */
      inptr0 = input_data[inrow];
      if (v == 0)               /* next nearest is row above */
        inptr1 = input_data[inrow - 1];
      else                      /* next nearest is row below */
        inptr1 = input_data[inrow + 1];
      outptr = output_data[outrow++];

      /* Special case for first column */
      thiscolsum = (*inptr0++) * 3 + (*inptr1++);
      nextcolsum = (*inptr0++) * 3 + (*inptr1++);
      *outptr++ = (JSAMPLE)((thiscolsum * 4 + 8) >> 4);
      *outptr++ = (JSAMPLE)((thiscolsum * 3 + nextcolsum + 7) >> 4);
      lastcolsum = thiscolsum;  thiscolsum = nextcolsum;

      for (colctr = compptr->downsampled_width - 2; colctr > 0; colctr--) {
        /* General case: 3/4 * nearer pixel + 1/4 * further pixel in each */
        /* dimension, thus 9/16, 3/16, 3/16, 1/16 overall */
        nextcolsum = (*inptr0++) * 3 + (*inptr1++);
        *outptr++ = (JSAMPLE)((thiscolsum * 3 + lastcolsum + 8) >> 4);
        *outptr++ = (JSAMPLE)((thiscolsum * 3 + nextcolsum + 7) >> 4);
        lastcolsum = thiscolsum;  thiscolsum = nextcolsum;
      }

      /* Special case for last column */
      *outptr++ = (JSAMPLE)((thiscolsum * 3 + lastcolsum + 8) >> 4);
      *outptr++ = (JSAMPLE)((thiscolsum * 4 + 7) >> 4);
    }
    inrow++;
  }
}